

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_example.cc
# Opt level: O1

GameResult SimulateGame(HanabiGame *game,bool verbose,mt19937 *rng)

{
  bool bVar1;
  EndOfGameType EVar2;
  int iVar3;
  uint uVar4;
  result_type rVar5;
  ostream *poVar6;
  ulong uVar7;
  long lVar8;
  GameResult GVar9;
  pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
  chance_outcomes;
  value_type move;
  uniform_int_distribution<unsigned_long> dist;
  vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  legal_moves;
  HanabiState state;
  pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
  local_170;
  HanabiMove local_140;
  ulong local_138;
  ulong local_130;
  string local_128;
  mt19937 *local_108;
  param_type local_100;
  HanabiState local_d0;
  
  local_108 = rng;
  hanabi_learning_env::HanabiState::HanabiState(&local_d0,game,-1);
  local_130 = 0;
  local_138 = 0;
  while( true ) {
    EVar2 = hanabi_learning_env::HanabiState::EndOfGameStatus(&local_d0);
    if (EVar2 != kNotFinished) break;
    if (local_d0.cur_player_ == -1) {
      hanabi_learning_env::HanabiState::ChanceOutcomes(&local_170,&local_d0);
      std::discrete_distribution<unsigned_long>::param_type::
      param_type<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
                (&local_100,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 local_170.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                 local_170.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish);
      rVar5 = std::discrete_distribution<unsigned_long>::operator()
                        ((discrete_distribution<unsigned_long> *)&local_100,local_108,&local_100);
      local_140 = local_170.first.
                  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                  ._M_impl.super__Vector_impl_data._M_start[rVar5];
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Legal chance:",0xd);
        if (local_170.first.
            super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_170.first.
            super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          lVar8 = 0;
          uVar7 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," <",2);
            hanabi_learning_env::HanabiMove::ToString_abi_cxx11_
                      (&local_128,
                       (HanabiMove *)
                       ((long)&(local_170.first.
                                super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                                ._M_impl.super__Vector_impl_data._M_start)->move_type_ + lVar8));
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cout,local_128._M_dataplus._M_p,
                                local_128._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,", ",2);
            poVar6 = std::ostream::_M_insert<double>
                               (*(double *)
                                 ((long)local_170.second.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start + lVar8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,">",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p);
            }
            uVar7 = uVar7 + 1;
            lVar8 = lVar8 + 8;
          } while (uVar7 < (ulong)((long)local_170.first.
                                         super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_170.first.
                                         super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Sampled move: ",0xe);
        hanabi_learning_env::HanabiMove::ToString_abi_cxx11_(&local_128,&local_140);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_128._M_dataplus._M_p,
                            local_128._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
      }
      hanabi_learning_env::HanabiState::ApplyMove(&local_d0,local_140);
      if (local_100._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_100._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_170.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_170.second.super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start);
      }
      if (local_170.first.
          super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_170.first.
                        super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      hanabi_learning_env::HanabiState::LegalMoves
                ((vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                  *)&local_100,&local_d0,local_d0.cur_player_);
      local_128._M_string_length =
           ((long)local_100._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_100._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) - 1;
      local_128._M_dataplus._M_p = (char *)0x0;
      rVar5 = std::uniform_int_distribution<unsigned_long>::operator()
                        ((uniform_int_distribution<unsigned_long> *)&local_128,local_108,
                         (param_type *)&local_128);
      local_140 = *(HanabiMove *)
                   (local_100._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + rVar5);
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Current player: ",0x10);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_d0.cur_player_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        hanabi_learning_env::HanabiState::ToString_abi_cxx11_((string *)&local_170,&local_d0);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            (char *)local_170.first.
                                    super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_170.first.
                                  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\n",2);
        if (local_170.first.
            super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&local_170.first.
                      super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_170.first.
                          super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Legal moves:",0xc)
        ;
        if (local_100._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            local_100._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          lVar8 = 0;
          uVar7 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," ",1);
            hanabi_learning_env::HanabiMove::ToString_abi_cxx11_
                      ((string *)&local_170,
                       (HanabiMove *)
                       ((long)local_100._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar8));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       (char *)local_170.first.
                               super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                       (long)local_170.first.
                             super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                             ._M_impl.super__Vector_impl_data._M_finish);
            if (local_170.first.
                super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pointer)&local_170.first.
                          super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              operator_delete(local_170.first.
                              super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                              ._M_impl.super__Vector_impl_data._M_start);
            }
            uVar7 = uVar7 + 1;
            lVar8 = lVar8 + 8;
          } while (uVar7 < (ulong)((long)local_100._M_prob.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish -
                                   (long)local_100._M_prob.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start >> 3));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Sampled move: ",0xe);
        hanabi_learning_env::HanabiMove::ToString_abi_cxx11_((string *)&local_170,&local_140);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            (char *)local_170.first.
                                    super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_170.first.
                                  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                                  ._M_impl.super__Vector_impl_data._M_finish);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\n",2);
        if (local_170.first.
            super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&local_170.first.
                      super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_170.first.
                          super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      hanabi_learning_env::HanabiState::ApplyMove(&local_d0,local_140);
      bVar1 = local_d0.move_history_.
              super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].scored;
      if (local_100._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_100._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      local_130 = (ulong)((int)local_130 + 1);
      local_138 = (ulong)((int)local_138 + (uint)bVar1);
    }
  }
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Game done, terminal state:\n",0x1b);
    hanabi_learning_env::HanabiState::ToString_abi_cxx11_((string *)&local_170,&local_d0);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,
                        (char *)local_170.first.
                                super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_170.first.
                              super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\n",2);
    if (local_170.first.
        super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&local_170.first.
                  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_170.first.
                      super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"score = ",8);
    iVar3 = hanabi_learning_env::HanabiState::Score(&local_d0);
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n\n",2);
  }
  uVar4 = hanabi_learning_env::HanabiState::Score(&local_d0);
  if (local_d0.fireworks_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.fireworks_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d0.move_history_.
      super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.move_history_.
                    super__Vector_base<hanabi_learning_env::HanabiHistoryItem,_std::allocator<hanabi_learning_env::HanabiHistoryItem>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>::
  ~vector(&local_d0.hands_);
  if (local_d0.discard_pile_.
      super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.discard_pile_.
                    super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d0.deck_.card_count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.deck_.card_count_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  GVar9._0_8_ = (ulong)uVar4 | local_138 << 0x20;
  GVar9.num_steps = (int)local_130;
  return GVar9;
}

Assistant:

GameResult SimulateGame(const hanabi_learning_env::HanabiGame& game,
                        bool verbose, std::mt19937* rng) {
  hanabi_learning_env::HanabiState state(&game);
  GameResult result = {0, 0, 0};
  while (!state.IsTerminal()) {
    if (state.CurPlayer() == hanabi_learning_env::kChancePlayerId) {
      // All of this could be replaced with state.ApplyRandomChance().
      // Only done this way to demonstrate picking specific chance moves.
      auto chance_outcomes = state.ChanceOutcomes();
      std::discrete_distribution<std::mt19937::result_type> dist(
          chance_outcomes.second.begin(), chance_outcomes.second.end());
      auto move = chance_outcomes.first[dist(*rng)];
      if (verbose) {
        std::cout << "Legal chance:";
        for (int i = 0; i < chance_outcomes.first.size(); ++i) {
          std::cout << " <" << chance_outcomes.first[i].ToString() << ", "
                    << chance_outcomes.second[i] << ">";
        }
        std::cout << "\n";
        std::cout << "Sampled move: " << move.ToString() << "\n\n";
      }
      state.ApplyMove(move);
      continue;
    }

    auto legal_moves = state.LegalMoves(state.CurPlayer());
    std::uniform_int_distribution<std::mt19937::result_type> dist(
        0, legal_moves.size() - 1);
    auto move = legal_moves[dist(*rng)];
    if (verbose) {
      std::cout << "Current player: " << state.CurPlayer() << "\n";
      std::cout << state.ToString() << "\n\n";
      std::cout << "Legal moves:";
      for (int i = 0; i < legal_moves.size(); ++i) {
        std::cout << " " << legal_moves[i].ToString();
      }
      std::cout << "\n";
      std::cout << "Sampled move: " << move.ToString() << "\n\n";
    }
    state.ApplyMove(move);
    ++result.num_steps;
    if (state.MoveHistory().back().scored) {
      ++result.fireworks_played;
    }
  }

  if (verbose) {
    std::cout << "Game done, terminal state:\n" << state.ToString() << "\n\n";
    std::cout << "score = " << state.Score() << "\n\n";
  }

  result.score = state.Score();
  return result;
}